

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O2

int FreeTypeFaceWrapper::IOutlineEnumerator::outline_moveto(FT_Vector *to,void *closure)

{
  bool bVar1;
  
  bVar1 = FTMoveto((IOutlineEnumerator *)closure,to);
  return (int)!bVar1;
}

Assistant:

int FreeTypeFaceWrapper::IOutlineEnumerator::outline_moveto(const FT_Vector* to, void *closure) //static
{
	return ( (FreeTypeFaceWrapper::IOutlineEnumerator *)closure )->FTMoveto(to) ? 0 : 1;
}